

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O3

void __thiscall
IRT::CCallSimplifierVisitor::Visit(CCallSimplifierVisitor *this,CCallExpression *expression)

{
  CExpression *pCVar1;
  CExpressionList *pCVar2;
  CCallExpression *this_00;
  CMoveStatement *this_01;
  CTempExpression *pCVar3;
  CEseqExpression *this_02;
  pointer *__ptr;
  CTemp temp;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_88;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_80;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_78;
  _Head_base<0UL,_const_IRT::CExpressionList_*,_false> local_70;
  undefined1 local_68 [40];
  char local_40 [32];
  
  pCVar2 = CCallExpression::getArguments(expression);
  (**(pCVar2->super_IExpression).super_INode._vptr_INode)(pCVar2,this);
  CTemp::CTemp((CTemp *)(local_68 + 0x18));
  this_00 = (CCallExpression *)operator_new(0x18);
  CCallExpression::getFunction(expression);
  CNameExpression::CopyCast((CNameExpression *)local_68);
  local_68._16_8_ = local_68._0_8_;
  local_68._0_8_ = (_func_int **)0x0;
  local_70._M_head_impl =
       (this->childExpressionList)._M_t.
       super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
       .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl;
  (this->childExpressionList)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
  .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl = (CExpressionList *)0x0;
  CCallExpression::CCallExpression
            (this_00,(unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                      *)(local_68 + 0x10),
             (unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
              *)&local_70);
  if (local_70._M_head_impl != (CExpressionList *)0x0) {
    (*((local_70._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_70._M_head_impl = (CExpressionList *)0x0;
  if ((_func_int **)local_68._16_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_68._16_8_ + 0x10))();
  }
  local_68._16_8_ = 0;
  if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_68._0_8_ + 0x10))();
  }
  this_01 = (CMoveStatement *)operator_new(0x18);
  pCVar3 = (CTempExpression *)operator_new(0x28);
  CTempExpression::CTempExpression(pCVar3,(CTemp *)(local_68 + 0x18));
  local_78._M_head_impl = (CExpression *)this_00;
  local_68._8_8_ = pCVar3;
  CMoveStatement::CMoveStatement
            (this_01,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      *)(local_68 + 8),
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_78);
  if ((CCallExpression *)local_78._M_head_impl != (CCallExpression *)0x0) {
    (*(((CExpression *)&(local_78._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_78._M_head_impl = (CExpression *)0x0;
  if ((CTempExpression *)local_68._8_8_ != (CTempExpression *)0x0) {
    (**(code **)(*(long *)local_68._8_8_ + 0x10))();
  }
  local_68._8_8_ = (pointer)0x0;
  this_02 = (CEseqExpression *)operator_new(0x18);
  local_88._M_head_impl = (CStatement *)this_01;
  pCVar3 = (CTempExpression *)operator_new(0x28);
  CTempExpression::CTempExpression(pCVar3,(CTemp *)(local_68 + 0x18));
  local_80._M_head_impl = (CExpression *)pCVar3;
  CEseqExpression::CEseqExpression
            (this_02,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                      *)&local_88,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_80);
  pCVar1 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)this_02;
  if (pCVar1 != (CExpression *)0x0) {
    (**(code **)((long)(pCVar1->super_IExpression).super_INode + 0x10))();
  }
  if ((CTempExpression *)local_80._M_head_impl != (CTempExpression *)0x0) {
    (*(((CExpression *)&(local_80._M_head_impl)->super_IExpression)->super_IExpression).super_INode.
      _vptr_INode[2])();
  }
  local_80._M_head_impl = (CExpression *)0x0;
  if ((CMoveStatement *)local_88._M_head_impl != (CMoveStatement *)0x0) {
    (*((INode *)&((local_88._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
      [2])();
  }
  local_88._M_head_impl = (CStatement *)0x0;
  if ((char *)local_68._24_8_ != local_40) {
    operator_delete((void *)local_68._24_8_);
  }
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CCallExpression &expression) {
    expression.getArguments()->Accept(*this);

    CTemp temp;

    std::unique_ptr<const CExpression> callExp = std::unique_ptr<const CExpression>(
            new CCallExpression(
                    std::move(expression.getFunction()->CopyCast()),
                    std::move(childExpressionList)
            )
    );

    std::unique_ptr<const CStatement> moveStm = std::unique_ptr<const CStatement>(
            new CMoveStatement(
                    std::move(std::unique_ptr<const CExpression>(new CTempExpression(temp))),
                    std::move(callExp)
            )
    );

    childExpression = std::move(
            std::unique_ptr<const CExpression>(
                new CEseqExpression(
                    std::move(moveStm),
                    std::move(std::unique_ptr<const CExpression>(new CTempExpression(temp)))
                )
            )
    );
}